

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O1

void cleanup_obj_make(void)

{
  long lVar1;
  long lVar2;
  
  if (L'\0' < num_money_types) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      string_free(*(char **)((long)&money_type->name + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (lVar2 < num_money_types);
  }
  mem_free(money_type);
  mem_free(alloc_ego_table);
  mem_free(obj_total_tval_great);
  mem_free(obj_total_tval);
  mem_free(obj_alloc_great);
  mem_free(obj_alloc);
  return;
}

Assistant:

static void cleanup_obj_make(void) {
	int i;
	for (i = 0; i < num_money_types; i++) {
		string_free(money_type[i].name);
	}
	mem_free(money_type);
	mem_free(alloc_ego_table);
	mem_free_alt(obj_total_tval_great);
	mem_free_alt(obj_total_tval);
	mem_free_alt(obj_alloc_great);
	mem_free_alt(obj_alloc);
}